

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O2

void __thiscall CMU462::HalfedgeMesh::splitPolygon(HalfedgeMesh *this,FaceIter f)

{
  size_type __n;
  undefined1 auVar1 [16];
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  pointer p_Var7;
  size_t i;
  Size SVar8;
  size_type __n_00;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  _List_iterator<CMU462::Halfedge> *hi;
  pointer p_Var14;
  size_type sVar15;
  bool bVar16;
  _List_node_base _Var17;
  _List_iterator<CMU462::Halfedge> local_118;
  pointer local_110;
  size_type local_108;
  pointer local_100;
  _List_node_base *local_f8;
  HalfedgeIter h;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_new_twin_vec;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_outer_vec;
  vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
  f_new_vec;
  vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
  e_new_vec;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  h_new_vec;
  vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
  v_outer_vec;
  
  SVar8 = Face::degree((Face *)(f._M_node + 1));
  if (SVar8 != 3) {
    h._M_node = f._M_node[9]._M_next;
    h_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    h_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    h_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n_00 = 0;
    local_f8 = f._M_node;
    do {
      sVar15 = __n_00;
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back(&h_outer_vec,&h);
      __n_00 = sVar15 + 1;
      h._M_node = h._M_node[1]._M_prev;
    } while (local_f8[9]._M_next != h._M_node);
    v_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    v_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::reserve(&v_outer_vec,__n_00);
    p_Var7 = h_outer_vec.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_108 = sVar15;
    for (p_Var14 = h_outer_vec.
                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; p_Var14 != p_Var7;
        p_Var14 = p_Var14 + 1) {
      std::
      vector<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
      ::push_back(&v_outer_vec,(value_type *)(p_Var14->_M_node + 2));
    }
    h_new_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    h_new_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    h_new_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    h_new_twin_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    h_new_twin_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    h_new_twin_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = sVar15 - 2;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::reserve(&h_new_vec,__n);
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::reserve(&h_new_twin_vec,__n);
    e_new_vec.
    super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    e_new_vec.
    super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    e_new_vec.
    super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>::
    reserve(&e_new_vec,__n);
    f_new_vec.
    super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    f_new_vec.
    super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    f_new_vec.
    super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>::
    reserve(&f_new_vec,__n);
    lVar9 = sVar15 - 2;
    while (bVar16 = lVar9 != 0, lVar9 = lVar9 + -1, bVar16) {
      local_118._M_node = (_List_node_base *)newHalfedge(this);
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
      ::emplace_back<std::_List_iterator<CMU462::Halfedge>>
                ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                  *)&h_new_vec,&local_118);
      local_118._M_node = (_List_node_base *)newHalfedge(this);
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
      ::emplace_back<std::_List_iterator<CMU462::Halfedge>>
                ((vector<std::_List_iterator<CMU462::Halfedge>,std::allocator<std::_List_iterator<CMU462::Halfedge>>>
                  *)&h_new_twin_vec,&local_118);
      local_118._M_node = (_List_node_base *)newEdge(this);
      std::
      vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>::
      emplace_back<std::_List_iterator<CMU462::Edge>>
                ((vector<std::_List_iterator<CMU462::Edge>,std::allocator<std::_List_iterator<CMU462::Edge>>>
                  *)&e_new_vec,(_List_iterator<CMU462::Edge> *)&local_118);
      local_118._M_node = (_List_node_base *)newFace(this);
      std::
      vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>::
      emplace_back<std::_List_iterator<CMU462::Face>>
                ((vector<std::_List_iterator<CMU462::Face>,std::allocator<std::_List_iterator<CMU462::Face>>>
                  *)&f_new_vec,(_List_iterator<CMU462::Face> *)&local_118);
    }
    for (lVar9 = 0; sVar15 - 2 != lVar9; lVar9 = lVar9 + 1) {
      e_new_vec.
      super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_node[5]._M_prev =
           h_new_vec.
           super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_node;
      f_new_vec.
      super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_node[9]._M_next =
           h_new_twin_vec.
           super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_node;
    }
    p_Var2 = (h_new_vec.
              super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_node;
    p_Var3 = (h_new_twin_vec.
              super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_node;
    local_110 = v_outer_vec.
                super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    p_Var4 = v_outer_vec.
             super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2]._M_node;
    local_100 = e_new_vec.
                super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    p_Var5 = (e_new_vec.
              super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_node;
    p_Var2[1]._M_prev =
         (h_outer_vec.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_node;
    p_Var2[1]._M_next = p_Var3;
    p_Var2[2]._M_next = p_Var4;
    p_Var2[2]._M_prev = p_Var5;
    p_Var2[3]._M_next = local_f8;
    h_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_start[1]._M_node[1]._M_prev =
         (h_new_vec.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->_M_node;
    uVar11 = 0;
    uVar13 = 2;
    uVar12 = 0;
    sVar15 = local_108;
    while (uVar10 = uVar13, uVar11 + 4 != __n_00) {
      p_Var2 = f_new_vec.
               super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
      uVar13 = sVar15;
      if ((uVar11 & 1) == 0) {
        p_Var3 = h_new_twin_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        p_Var4 = v_outer_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_node;
        p_Var5 = e_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        p_Var6 = (h_new_vec.
                  super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar11)[1]._M_node;
        p_Var3[1]._M_next =
             h_new_vec.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        p_Var3[1]._M_prev = p_Var6;
        p_Var3[2]._M_next = p_Var4;
        p_Var3[2]._M_prev = p_Var5;
        p_Var3[3]._M_next = p_Var2;
        p_Var2 = h_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11 + 1]._M_node;
        p_Var3 = h_new_twin_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11 + 1]._M_node;
        p_Var4 = v_outer_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_node;
        p_Var5 = e_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11 + 1]._M_node;
        p_Var6 = f_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        p_Var2[1]._M_prev =
             h_outer_vec.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar15]._M_node;
        p_Var2[1]._M_next = p_Var3;
        p_Var2[2]._M_next = p_Var4;
        p_Var2[2]._M_prev = p_Var5;
        p_Var2[3]._M_next = p_Var6;
        h_outer_vec.
        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar15]._M_node[1]._M_prev =
             h_new_twin_vec.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        h_outer_vec.
        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar15]._M_node[3]._M_next =
             f_new_vec.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        uVar11 = uVar11 | 1;
        uVar12 = uVar10;
        sVar15 = uVar10 + 1;
      }
      else {
        p_Var3 = h_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11 + 1]._M_node;
        p_Var4 = v_outer_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[sVar15]._M_node;
        p_Var5 = e_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11 + 1]._M_node;
        auVar1 = *(undefined1 (*) [16])
                  (h_new_twin_vec.
                   super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar11);
        _Var17._M_next = auVar1._8_8_;
        _Var17._M_prev._0_4_ = auVar1._0_4_;
        _Var17._M_prev._4_4_ = auVar1._4_4_;
        p_Var3[1] = _Var17;
        p_Var3[2]._M_next = p_Var4;
        p_Var3[2]._M_prev = p_Var5;
        p_Var3[3]._M_next = p_Var2;
        p_Var2 = h_new_twin_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        p_Var3 = h_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        p_Var4 = v_outer_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_node;
        p_Var5 = e_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        p_Var6 = f_new_vec.
                 super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        p_Var2[1]._M_prev =
             h_outer_vec.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_node;
        p_Var2[1]._M_next = p_Var3;
        p_Var2[2]._M_next = p_Var4;
        p_Var2[2]._M_prev = p_Var5;
        p_Var2[3]._M_next = p_Var6;
        h_outer_vec.
        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_node[1]._M_prev =
             h_new_vec.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11 + 1]._M_node;
        h_outer_vec.
        super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_node[3]._M_next =
             f_new_vec.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_node;
        uVar11 = uVar11 + 1;
        uVar12 = uVar10;
        sVar15 = uVar10 - 1;
      }
    }
    p_Var2 = h_new_twin_vec.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    p_Var3 = h_new_vec.
             super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    p_Var4 = e_new_vec.
             super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    uVar13 = uVar12;
    if ((local_108 & 1) == 0) {
      uVar13 = uVar10;
      uVar10 = uVar12;
    }
    p_Var5 = f_new_vec.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    p_Var6 = v_outer_vec.
             super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_node;
    p_Var2[1]._M_prev =
         h_outer_vec.
         super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_node;
    p_Var2[1]._M_next = p_Var3;
    p_Var2[2]._M_next = p_Var6;
    p_Var2[2]._M_prev = p_Var4;
    p_Var2[3]._M_next = p_Var5;
    p_Var2 = f_new_vec.
             super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    h_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_node[3]._M_next = p_Var2;
    h_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_start[sVar15]._M_node[3]._M_next = p_Var2;
    h_outer_vec.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_start[sVar15]._M_node[1]._M_prev =
         h_new_twin_vec.
         super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_node;
    std::
    _Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
    ::~_Vector_base(&f_new_vec.
                     super__Vector_base<std::_List_iterator<CMU462::Face>,_std::allocator<std::_List_iterator<CMU462::Face>_>_>
                   );
    std::
    _Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
    ::~_Vector_base(&e_new_vec.
                     super__Vector_base<std::_List_iterator<CMU462::Edge>,_std::allocator<std::_List_iterator<CMU462::Edge>_>_>
                   );
    std::
    _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~_Vector_base(&h_new_twin_vec.
                     super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   );
    std::
    _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~_Vector_base(&h_new_vec.
                     super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   );
    std::
    _Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
    ::~_Vector_base(&v_outer_vec.
                     super__Vector_base<std::_List_iterator<CMU462::Vertex>,_std::allocator<std::_List_iterator<CMU462::Vertex>_>_>
                   );
    std::
    _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~_Vector_base(&h_outer_vec.
                     super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   );
  }
  return;
}

Assistant:

void HalfedgeMesh::splitPolygon(FaceIter f) {
  // Triangulate a polygonal face

  // If already triangle, return
  if (f->degree() == 3) {
    return;
  }

  // Collect
  // HalfEdges
  auto h = f->halfedge();
  size_t degree = 0;
  vector<HalfedgeIter> h_outer_vec;
  do {
    ++degree;
    h_outer_vec.push_back(h);
    h = h->next();
  } while (h != f->halfedge());

  // Vertices
  vector<VertexIter> v_outer_vec;
  v_outer_vec.reserve(degree);
  for (const auto& hi : h_outer_vec) {
    v_outer_vec.push_back(hi->vertex());
  }

  // Allocate
  // HalfEdges
  vector<HalfedgeIter> h_new_vec, h_new_twin_vec;
  h_new_vec.reserve(degree - 3);
  h_new_twin_vec.reserve(degree - 3);

  // Edges
  vector<EdgeIter> e_new_vec;
  e_new_vec.reserve(degree - 3);

  // Faces
  vector<FaceIter> f_new_vec;
  f_new_vec.reserve(degree - 3);

  for (size_t i = 0; i < degree - 3; ++i) {
    h_new_vec.push_back(newHalfedge());
    h_new_twin_vec.push_back(newHalfedge());

    e_new_vec.push_back(newEdge());

    f_new_vec.push_back(newFace());
  }

  // Reassign
  // New edges and faces
  for (size_t i = 0; i < degree - 3; ++i) {
    e_new_vec[i]->halfedge() = h_new_vec[i];
    f_new_vec[i]->halfedge() = h_new_twin_vec[i];
  }

  // Halfedges of the first face
  h_new_vec[0]->setNeighbors(h_outer_vec[0],
                             h_new_twin_vec[0],
                             v_outer_vec[2],
                             e_new_vec[0],
                             f);
  h_outer_vec[1]->next() = h_new_vec[0];

  // Halfedges of the middle faces
  size_t first_v = 0, second_v = 2, third_v = degree - 1, t;
  for (size_t i = 0; i < degree - 4; ++i) {
    if (i % 2 == 0) {
      h_new_twin_vec[i]->setNeighbors(h_new_vec[i + 1],
                                      h_new_vec[i],
                                      v_outer_vec[first_v],
                                      e_new_vec[i],
                                      f_new_vec[i]);
      h_new_vec[i + 1]->setNeighbors(h_outer_vec[third_v],
                                     h_new_twin_vec[i + 1],
                                     v_outer_vec[second_v],
                                     e_new_vec[i + 1],
                                     f_new_vec[i]);
      h_outer_vec[third_v]->next() = h_new_twin_vec[i];
      h_outer_vec[third_v]->face() = f_new_vec[i];
      t = second_v + 1;
      first_v = second_v;
      second_v = third_v;
      third_v = t;
    } else {
      h_new_vec[i + 1]->setNeighbors(h_new_twin_vec[i],
                                     h_new_twin_vec[i + 1],
                                     v_outer_vec[third_v],
                                     e_new_vec[i + 1],
                                     f_new_vec[i]);
      h_new_twin_vec[i]->setNeighbors(h_outer_vec[first_v],
                                      h_new_vec[i],
                                      v_outer_vec[second_v],
                                      e_new_vec[i],
                                      f_new_vec[i]);
      h_outer_vec[first_v]->next() = h_new_vec[i + 1];
      h_outer_vec[first_v]->face() = f_new_vec[i];
      t = second_v - 1;
      first_v = second_v;
      second_v = third_v;
      third_v = t;
    }
  }

  // Halfedges of the final faces
  if (degree % 2 == 0) {
    h_new_twin_vec.back()->setNeighbors(h_outer_vec[second_v],
                                        h_new_vec.back(),
                                        v_outer_vec[first_v],
                                        e_new_vec.back(),
                                        f_new_vec.back());
    h_outer_vec[second_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->next() = h_new_twin_vec.back();
  } else {
    h_new_twin_vec.back()->setNeighbors(h_outer_vec[first_v],
                                        h_new_vec.back(),
                                        v_outer_vec[second_v],
                                        e_new_vec.back(),
                                        f_new_vec.back());
    h_outer_vec[first_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->face() = f_new_vec.back();
    h_outer_vec[third_v]->next() = h_new_twin_vec.back();
  }
}